

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O0

void resampler_clear(void *_r)

{
  undefined4 *in_RDI;
  resampler *r;
  
  *in_RDI = 0xf;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  *(undefined8 *)(in_RDI + 4) = 0;
  *(undefined1 *)((long)in_RDI + 0x31) = 0xff;
  *(undefined1 *)((long)in_RDI + 0x32) = 0xff;
  memset(in_RDI + 0x12,0,0x3c);
  memset(in_RDI + 0x52,0,0x3c);
  if ((*(char *)(in_RDI + 0xc) == '\x01') || (*(char *)(in_RDI + 0xc) == '\x03')) {
    *(undefined8 *)(in_RDI + 8) = 0;
    *(undefined8 *)(in_RDI + 0xe) = 0;
    *(undefined8 *)(in_RDI + 0x10) = 0;
    memset(in_RDI + 0x92,0,0x17c);
  }
  return;
}

Assistant:

void resampler_clear(void *_r)
{
    resampler * r = ( resampler * ) _r;
    r->write_pos = SINC_WIDTH - 1;
    r->write_filled = 0;
    r->read_pos = 0;
    r->read_filled = 0;
    r->phase.quad = 0;
    r->delay_added = -1;
    r->delay_removed = -1;
    memset(r->buffer_in, 0, (SINC_WIDTH - 1) * sizeof(r->buffer_in[0]));
    memset(r->buffer_in + resampler_buffer_size, 0, (SINC_WIDTH - 1) * sizeof(r->buffer_in[0]));
    if (r->quality == RESAMPLER_QUALITY_BLEP || r->quality == RESAMPLER_QUALITY_BLAM)
    {
        r->inv_phase.quad = 0;
        r->last_amp = 0;
        r->accumulator = 0;
        memset(r->buffer_out, 0, sizeof(r->buffer_out));
    }
}